

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

BOOL PROCEndProcess(HANDLE hProcess,UINT uExitCode,BOOL bTerminateUnconditionally)

{
  DWORD __pid;
  DWORD DVar1;
  int iVar2;
  int *piVar3;
  BOOL bTerminateUnconditionally_00;
  DWORD dwErrCode;
  
  __pid = PROCGetProcessIDFromHandle(hProcess);
  bTerminateUnconditionally_00 = (BOOL)hProcess;
  dwErrCode = 6;
  if (__pid == 0) {
LAB_00342811:
    SetLastError(dwErrCode);
    return 0;
  }
  DVar1 = GetCurrentProcessId();
  if (__pid == DVar1) {
    if ((((bTerminateUnconditionally == 0) && (uExitCode < 0x100)) ||
        (PAL_InitializeChakraCoreCalled != false)) &&
       ((CorUnix::TerminateCurrentProcessNoExit(bTerminateUnconditionally_00),
        PAL_InitializeChakraCoreCalled != false &&
        (PAL_Leave(PAL_BoundaryBottom), bTerminateUnconditionally == 0)))) {
      exit(uExitCode);
    }
  }
  else if ((uExitCode == 0) || (PAL_InitializeChakraCoreCalled != false)) {
    iVar2 = kill(__pid,9);
    if (iVar2 == 0) {
      return 1;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 3) {
      if (*piVar3 == 1) {
        dwErrCode = 5;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","PROCEndProcess",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x4ed);
        fprintf(_stderr,(char *)0x0);
        dwErrCode = 0x54f;
      }
    }
    goto LAB_00342811;
  }
  abort();
}

Assistant:

static BOOL PROCEndProcess(HANDLE hProcess, UINT uExitCode, BOOL bTerminateUnconditionally)
{
    DWORD dwProcessId;
    BOOL ret = FALSE;

    dwProcessId = PROCGetProcessIDFromHandle(hProcess);
    if (dwProcessId == 0)
    {
        SetLastError(ERROR_INVALID_HANDLE);
    }
    else if(dwProcessId != GetCurrentProcessId())
    {
        if (uExitCode != 0)
            WARN("exit code 0x%x ignored for external process.\n", uExitCode);

        if (kill(dwProcessId, SIGKILL) == 0)
        {
            ret = TRUE;
        }
        else
        {
            switch (errno) {
            case ESRCH:
                SetLastError(ERROR_INVALID_HANDLE);
                break;
            case EPERM:
                SetLastError(ERROR_ACCESS_DENIED);
                break;
            default:
                // Unexpected failure.
                ASSERT(FALSE);
                SetLastError(ERROR_INTERNAL_ERROR);
                break;
            }
        }
    }
    else
    {
        // WARN/ERROR before starting the termination process and/or leaving the PAL.
        if (bTerminateUnconditionally)
        {
            WARN("exit code 0x%x ignored for terminate.\n", uExitCode);
        }
        else if ((uExitCode & 0xff) != uExitCode)
        {
            // TODO: Convert uExitCodes into sysexits(3)?
            ERROR("exit() only supports the lower 8-bits of an exit code. "
                "status will only see error 0x%x instead of 0x%x.\n", uExitCode & 0xff, uExitCode);
        }

        TerminateCurrentProcessNoExit(bTerminateUnconditionally);

        LOGEXIT("PROCEndProcess will not return\n");

        // exit() runs atexit handlers possibly registered by foreign code.
        // The right thing to do here is to leave the PAL.  If our client
        // registered our own PAL_Terminate with atexit(), the latter will
        // explicitly re-enter us.
        PAL_Leave(PAL_BoundaryBottom);

        if (bTerminateUnconditionally)
        {
            // abort() has the semantics that
            // (1) it doesn't run atexit handlers
            // (2) can invoke CrashReporter or produce a coredump,
            // which is appropriate for TerminateProcess calls

            // If this turns out to be inappropriate for some case, where we
            // call TerminateProcess vs. ExitProcess, then there needs to be
            // a CLR wrapper for TerminateProcess and some exposure for PAL_abort()
            // to selectively use that in all but those cases.

            abort();
        }
        else
        {
            exit(uExitCode);
        }

        ASSERT(FALSE); // we shouldn't get here
    }

    return ret;
}